

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O2

vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
* __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::uncovered
          (vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
           *__return_storage_ptr__,DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,
          IntervalT *I)

{
  const_iterator cVar1;
  Offset OVar2;
  _Rb_tree_header *p_Var3;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ret;
  IntervalT cur;
  DiscreteInterval<dg::Offset> local_48;
  Offset local_38;
  
  if ((this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_001222a6:
    ret.
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(I->start).offset;
    ret.
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(I->end).offset;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
    ::_M_range_initialize<dg::ADT::DiscreteInterval<dg::Offset>const*>
              ((vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
                *)__return_storage_ptr__,&ret);
    return __return_storage_ptr__;
  }
  cVar1 = le(this,I);
  p_Var3 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node == p_Var3) goto LAB_001222a6;
  ret.
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ret.
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ret.
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OVar2.offset = (I->start).offset;
  cur.end.offset = (I->end).offset;
  cur.start.offset = OVar2.offset;
  if (*(ulong *)(cVar1._M_node + 1) < OVar2.offset) {
    if ((_Base_ptr)(I->end).offset <= cVar1._M_node[1]._M_parent) {
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_00122375;
    }
    OVar2 = Offset::operator+((Offset *)&cVar1._M_node[1]._M_parent,(Offset)0x1);
    cur.start = OVar2;
    cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node);
    if (((_Rb_tree_header *)cVar1._M_node == p_Var3) && (OVar2.offset <= cur.end.offset)) {
      local_48.start.offset = cur.start.offset;
      local_48.end.offset = cur.end.offset;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
      ::_M_range_initialize<dg::ADT::DiscreteInterval<dg::Offset>const*>
                ((vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
                  *)__return_storage_ptr__,&local_48);
      goto LAB_00122375;
    }
  }
  do {
    if (OVar2.offset < *(ulong *)(cVar1._M_node + 1)) {
      local_38.offset = 1;
      local_48.end = Offset::operator-((Offset *)(cVar1._M_node + 1),&local_38);
      local_48.start.offset = OVar2.offset;
      std::
      vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
      ::emplace_back<dg::ADT::DiscreteInterval<dg::Offset>>
                ((vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
                  *)&ret,&local_48);
    }
    if ((_Base_ptr)(I->end).offset <= cVar1._M_node[1]._M_parent) goto LAB_0012234b;
    OVar2 = Offset::operator+((Offset *)&cVar1._M_node[1]._M_parent,(Offset)0x1);
    cur.start = OVar2;
    cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node);
  } while ((_Rb_tree_header *)cVar1._M_node != p_Var3);
  if (OVar2.offset <= cur.end.offset) {
    std::
    vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ::push_back(&ret,&cur);
  }
LAB_0012234b:
  (__return_storage_ptr__->
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       ret.
       super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       ret.
       super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       ret.
       super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ret.
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ret.
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ret.
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00122375:
  std::
  _Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ::~_Vector_base(&ret.
                   super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

std::vector<IntervalT> uncovered(const IntervalT &I) const {
        if (_mapping.empty())
            return {I};

        auto it = le(I);
        if (it == end())
            return {I};

        std::vector<IntervalT> ret;
        IntervalT cur = I;

        if (cur.start > it->first.start) {
            // the first interval covers the whole I?
            if (it->first.end >= I.end) {
                return {};
            }

            assert(cur == I);
            cur.start = it->first.end + 1;
            assert(cur.end == I.end);
            assert(I.end > it->first.end);
            // we handled this interval, move further
            ++it;

            // nothing else to handle...
            if (it == _mapping.end()) {
                if (cur.start <= cur.end)
                    return {cur};
            }
        }

        while (true) {
            assert(cur.start <= it->first.start);
            if (cur.start != it->first.start && cur.start < it->first.start) {
                assert(it->first.start != 0 && "Underflow");
                ret.push_back(IntervalT{cur.start, it->first.start - 1});
            }
            // does the rest of the interval covers all?
            if (it->first.end >= I.end)
                break;

            assert(it->first.end != (~static_cast<IntervalValueT>(0)) &&
                   "Overflow");
            cur.start = it->first.end + 1;
            assert(cur.end == I.end);

            ++it;
            if (it == end()) {
                if (cur.start <= cur.end)
                    ret.push_back(cur);
                // we're done here
                break;
            }
        }

        return ret;
    }